

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::FileDescriptorSet::_InternalParse
          (FileDescriptorSet *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  undefined1 auVar5 [12];
  char cVar6;
  FileDescriptorProto *msg;
  uint32 res;
  uint tag;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_bool> pVar8;
  
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar8._8_8_ = 0;
      pVar8.first = ptr;
    }
    else {
      pVar8._8_8_ = 1;
      pVar8.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar8 = internal::EpsCopyInputStream::DoneFallback
                          (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    p = (byte *)pVar8.first;
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)p;
    }
    bVar1 = *p;
    auVar5[8] = bVar1;
    auVar5._0_8_ = p + 1;
    auVar5._9_3_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar7 = internal::ReadTagFallback((char *)p,res);
        auVar5 = pVar7._0_12_;
      }
      else {
        auVar5._8_4_ = res;
        auVar5._0_8_ = p + 2;
      }
    }
    ptr = auVar5._0_8_;
    if (ptr == (char *)0x0) {
LAB_002f19bc:
      cVar6 = '\x04';
    }
    else {
      tag = auVar5._8_4_;
      if (tag == 10) {
        ptr = ptr + -1;
        do {
          pRVar4 = (this->file_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_002f1912:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->file_).super_RepeatedPtrFieldBase,
                       (this->file_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f1920:
            pRVar4 = (this->file_).super_RepeatedPtrFieldBase.rep_;
            pRVar4->allocated_size = pRVar4->allocated_size + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>
                            ((this->file_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->file_).super_RepeatedPtrFieldBase.rep_;
            iVar3 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
            (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pRVar4->elements[iVar3] = msg;
          }
          else {
            iVar3 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar3) {
              if (pRVar4->allocated_size == (this->file_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_002f1912;
              goto LAB_002f1920;
            }
            (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (FileDescriptorProto *)pRVar4->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::FileDescriptorProto>
                          (ctx,msg,ptr + 1);
          if (ptr == (char *)0x0) goto LAB_002f19bc;
          cVar6 = '\x02';
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '\n'));
      }
      else if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar6 = '\t';
      }
      else {
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
        cVar6 = (ptr == (char *)0x0) * '\x02' + '\x02';
      }
    }
    if (cVar6 != '\x02') {
      if (cVar6 == '\x04') {
        ptr = (char *)0x0;
      }
      return ptr;
    }
  } while( true );
}

Assistant:

const char* FileDescriptorSet::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.FileDescriptorProto file = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}